

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  cmLocalGenerator *this_00;
  byte bVar1;
  bool bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar3;
  cmMakefile *this_02;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  reference pbVar7;
  cmState *this_03;
  reference pbVar8;
  string local_5c8;
  allocator local_5a1;
  string local_5a0;
  undefined1 local_580 [8];
  string linkSourceDirectory;
  undefined1 local_558 [8];
  string sourceLinkedResourceName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_530;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_528;
  const_iterator nit_1;
  string local_518;
  undefined1 local_4f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string local_4d8;
  char *local_4b8;
  char *extraNaturesProp;
  _Self local_4a8;
  const_iterator nit;
  string local_480;
  string local_460;
  allocator local_43a;
  allocator local_439;
  string local_438;
  string local_418 [8];
  string makeArgs;
  string local_3f0;
  undefined1 local_3d0 [8];
  string make;
  allocator local_38a;
  allocator local_389;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  allocator local_301;
  string local_300;
  allocator local_2da;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  string compilerId;
  undefined1 local_288 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  this_00 = *ppcVar3;
  this_02 = cmLocalGenerator::GetMakefile(this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeOutputDirectory,"/.project");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_288,pcVar4,false);
  bVar1 = std::ios::operator!((ios *)(local_288 + (long)*(_func_int **)((long)local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"CMAKE_C_COMPILER_ID",&local_2d9);
    pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_2b8,pcVar4,&local_2da);
    std::allocator<char>::~allocator((allocator<char> *)&local_2da);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_300,"CMAKE_CXX_COMPILER_ID",&local_301);
      pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_300);
      std::__cxx11::string::operator=((string *)local_2b8,pcVar4);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
    }
    poVar6 = std::operator<<((ostream *)local_288,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>"
                            );
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_348,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"CMAKE_BUILD_TYPE",&local_389);
    pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_388);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_368,pcVar4,&local_38a);
    GetPathBasename((string *)((long)&make.field_2 + 8),&this->HomeOutputDirectory);
    GenerateProjectName(&local_328,&local_348,&local_368,(string *)((long)&make.field_2 + 8));
    poVar6 = std::operator<<(poVar6,(string *)&local_328);
    std::operator<<(poVar6,
                    "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n\t\t\t<triggers>clean,full,incremental,</triggers>\n\t\t\t<arguments>\n"
                   );
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)(make.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_38a);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    std::__cxx11::string::~string((string *)&local_348);
    std::operator<<((ostream *)local_288,
                    "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n"
                   );
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3f0,"CMAKE_MAKE_PROGRAM",
               (allocator *)(makeArgs.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetRequiredDefinition(this_02,&local_3f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_3d0,pcVar4,(allocator *)(makeArgs.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)(makeArgs.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_438,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",&local_439);
    pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_438);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_418,pcVar4,&local_43a);
    std::allocator<char>::~allocator((allocator<char> *)&local_43a);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
    poVar6 = std::operator<<((ostream *)local_288,
                             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n\t\t\t\t\t<value>"
                            );
    GetEclipsePath(&local_460,(string *)local_3d0);
    poVar6 = std::operator<<(poVar6,(string *)&local_460);
    poVar6 = std::operator<<(poVar6,
                             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n\t\t\t\t\t<value>"
                            );
    poVar6 = std::operator<<(poVar6,local_418);
    poVar6 = std::operator<<(poVar6,
                             "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n\t\t\t\t\t<value>"
                            );
    GetEclipsePath(&local_480,&this->HomeOutputDirectory);
    poVar6 = std::operator<<(poVar6,(string *)&local_480);
    std::operator<<(poVar6,
                    "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n"
                   );
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
    std::operator<<((ostream *)local_288,
                    "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"
                   );
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      AddEnvVar((cmGeneratedFileStream *)local_288,"PATH",this_00);
      AddEnvVar((cmGeneratedFileStream *)local_288,"INCLUDE",this_00);
      AddEnvVar((cmGeneratedFileStream *)local_288,"LIB",this_00);
      AddEnvVar((cmGeneratedFileStream *)local_288,"LIBPATH",this_00);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        AddEnvVar((cmGeneratedFileStream *)local_288,"INTEL_LICENSE_FILE",this_00);
      }
    }
    std::operator<<((ostream *)local_288,"</value>\n\t\t\t\t</dictionary>\n");
    poVar6 = std::operator<<((ostream *)local_288,
                             "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n\t\t\t\t\t<value>true</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n\t\t\t\t\t<value>false</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n\t\t\t\t\t<value>clean</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n\t\t\t\t\t<value></value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n\t\t\t\t\t<value>"
                            );
    GetEclipsePath((string *)&nit,&this->HomeOutputDirectory);
    poVar6 = std::operator<<(poVar6,(string *)&nit);
    std::operator<<(poVar6,
                    "</value>\n\t\t\t\t</dictionary>\n\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n\t\t\t\t\t<value>all</value>\n\t\t\t\t</dictionary>\n"
                   );
    std::__cxx11::string::~string((string *)&nit);
    std::operator<<((ostream *)local_288,
                    "\t\t\t\t<dictionary>\n\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n\t\t\t\t\t<value>"
                   );
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      std::operator<<((ostream *)local_288,"org.eclipse.cdt.core.VCErrorParser;");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        std::operator<<((ostream *)local_288,"org.eclipse.cdt.core.ICCErrorParser;");
      }
    }
    if ((this->SupportsGmakeErrorParser & 1U) == 0) {
      std::operator<<((ostream *)local_288,"org.eclipse.cdt.core.MakeErrorParser;");
    }
    else {
      std::operator<<((ostream *)local_288,"org.eclipse.cdt.core.GmakeErrorParser;");
    }
    std::operator<<((ostream *)local_288,
                    "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;</value>\n\t\t\t\t</dictionary>\n"
                   );
    std::operator<<((ostream *)local_288,
                    "\t\t\t</arguments>\n\t\t</buildCommand>\n\t\t<buildCommand>\n\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n\t\t\t<arguments>\n\t\t\t</arguments>\n\t\t</buildCommand>\n\t</buildSpec>\n"
                   );
    std::operator<<((ostream *)local_288,
                    "\t<natures>\n\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n"
                   );
    local_4a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Natures);
    while( true ) {
      extraNaturesProp =
           (char *)std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->Natures);
      bVar2 = std::operator!=(&local_4a8,(_Self *)&extraNaturesProp);
      if (!bVar2) break;
      poVar6 = std::operator<<((ostream *)local_288,"\t\t<nature>");
      pbVar7 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_4a8);
      poVar6 = std::operator<<(poVar6,(string *)pbVar7);
      std::operator<<(poVar6,"</nature>\n");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_4a8);
    }
    this_03 = cmMakefile::GetState(this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_4d8,"ECLIPSE_EXTRA_NATURES",
               (allocator *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmState::GetGlobalProperty(this_03,&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_4b8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4f8);
      pcVar4 = local_4b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_518,pcVar4,(allocator *)((long)&nit_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_518,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f8,false);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator((allocator<char> *)((long)&nit_1._M_current + 7));
      local_530._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4f8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_528,&local_530);
      while( true ) {
        sourceLinkedResourceName.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4f8);
        bVar2 = __gnu_cxx::operator!=
                          (&local_528,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&sourceLinkedResourceName.field_2 + 8));
        if (!bVar2) break;
        poVar6 = std::operator<<((ostream *)local_288,"\t\t<nature>");
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_528);
        poVar6 = std::operator<<(poVar6,(string *)pbVar8);
        std::operator<<(poVar6,"</nature>\n");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_528);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4f8);
    }
    std::operator<<((ostream *)local_288,"\t</natures>\n");
    std::operator<<((ostream *)local_288,"\t<linkedResources>\n");
    if ((this->IsOutOfSourceBuild & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_558,"[Source directory]",
                 (allocator *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5a0,pcVar4,&local_5a1);
      GetEclipsePath((string *)local_580,&local_5a0);
      std::__cxx11::string::~string((string *)&local_5a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,(string *)local_580);
      if (!bVar2) {
        GetEclipsePath(&local_5c8,(string *)local_580);
        AppendLinkedResource
                  ((cmGeneratedFileStream *)local_288,(string *)local_558,&local_5c8,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_5c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->SrcLinkedResources,(value_type *)local_558);
      }
      std::__cxx11::string::~string((string *)local_580);
      std::__cxx11::string::~string((string *)local_558);
    }
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmGeneratedFileStream *)local_288,&this->HomeOutputDirectory);
      CreateLinksForTargets(this,(cmGeneratedFileStream *)local_288);
    }
    std::operator<<((ostream *)local_288,"\t</linkedResources>\n");
    std::operator<<((ostream *)local_288,"</projectDescription>\n");
    std::__cxx11::string::~string(local_418);
    std::__cxx11::string::~string((string *)local_3d0);
    std::__cxx11::string::~string((string *)local_2b8);
    compilerId.field_2._8_4_ = 0;
  }
  else {
    compilerId.field_2._8_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty())  // no C compiler, try the C++ compiler:
    {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" <<
    this->GenerateProjectName(lg->GetProjectName(),
                              mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                              this->GetPathBasename(this->HomeOutputDirectory))
    << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.makeBuilder</name>\n"
    "\t\t\t<triggers>clean,full,incremental,</triggers>\n"
    "\t\t\t<arguments>\n"
    ;

  // use clean target
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.cleanBuildTarget</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableCleanBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.append_environment</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.stopOnError</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set the make command
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  const std::string makeArgs = mf->GetSafeDefinition(
                                               "CMAKE_ECLIPSE_MAKE_ARGUMENTS");

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enabledIncrementalBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.command</key>\n"
    "\t\t\t\t\t<value>" << this->GetEclipsePath(make) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.contents</key>\n"
    "\t\t\t\t\t<value>org.eclipse.cdt.make.core.activeConfigSettings</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.inc</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.arguments</key>\n"
    "\t\t\t\t\t<value>" << makeArgs << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildLocation</key>\n"
    "\t\t\t\t\t<value>"
     << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.useDefaultBuildCmd</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set project specific environment
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.environment</key>\n"
    "\t\t\t\t\t<value>VERBOSE=1|CMAKE_NO_VERBOSE=1|"  //verbose Makefile output
    ;
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC")
    {
    AddEnvVar(fout, "PATH", lg);
    AddEnvVar(fout, "INCLUDE", lg);
    AddEnvVar(fout, "LIB", lg);
    AddEnvVar(fout, "LIBPATH", lg);
    }
  else if (compilerId == "Intel")
    {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(fout, "INTEL_LICENSE_FILE", lg);
    }
  fout <<
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableFullBuild</key>\n"
    "\t\t\t\t\t<value>true</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.auto</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.enableAutoBuild</key>\n"
    "\t\t\t\t\t<value>false</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.target.clean</key>\n"
    "\t\t\t\t\t<value>clean</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.fullBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.buildArguments</key>\n"
    "\t\t\t\t\t<value></value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.build.location</key>\n"
    "\t\t\t\t\t<value>"
    << this->GetEclipsePath(this->HomeOutputDirectory) << "</value>\n"
    "\t\t\t\t</dictionary>\n"
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.make.core.autoBuildTarget</key>\n"
    "\t\t\t\t\t<value>all</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  // set error parsers
  fout <<
    "\t\t\t\t<dictionary>\n"
    "\t\t\t\t\t<key>org.eclipse.cdt.core.errorOutputParser</key>\n"
    "\t\t\t\t\t<value>"
    ;
  if (compilerId == "MSVC")
    {
    fout << "org.eclipse.cdt.core.VCErrorParser;";
    }
  else if (compilerId == "Intel")
    {
    fout << "org.eclipse.cdt.core.ICCErrorParser;";
    }

  if (this->SupportsGmakeErrorParser)
    {
    fout << "org.eclipse.cdt.core.GmakeErrorParser;";
    }
  else
    {
    fout << "org.eclipse.cdt.core.MakeErrorParser;";
    }

  fout <<
    "org.eclipse.cdt.core.GCCErrorParser;"
    "org.eclipse.cdt.core.GASErrorParser;"
    "org.eclipse.cdt.core.GLDErrorParser;"
    "</value>\n"
    "\t\t\t\t</dictionary>\n"
    ;

  fout <<
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t\t<buildCommand>\n"
    "\t\t\t<name>org.eclipse.cdt.make.core.ScannerConfigBuilder</name>\n"
    "\t\t\t<arguments>\n"
    "\t\t\t</arguments>\n"
    "\t\t</buildCommand>\n"
    "\t</buildSpec>\n"
    ;

  // set natures for c/c++ projects
  fout <<
    "\t<natures>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.makeNature</nature>\n"
    "\t\t<nature>org.eclipse.cdt.make.core.ScannerConfigNature</nature>\n";

  for (std::set<std::string>::const_iterator nit=this->Natures.begin();
       nit != this->Natures.end(); ++nit)
    {
    fout << "\t\t<nature>" << *nit << "</nature>\n";
    }

  if (const char *extraNaturesProp = mf->GetState()
        ->GetGlobalProperty("ECLIPSE_EXTRA_NATURES"))
    {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit)
      {
      fout << "\t\t<nature>" << *nit << "</nature>\n";
      }
    }

  fout << "\t</natures>\n";

  fout << "\t<linkedResources>\n";
  // create linked resources
  if (this->IsOutOfSourceBuild)
    {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // http://public.kitware.com/Bug/view.php?id=9978 and because I found it
    // actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory = this->GetEclipsePath(
                                             lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                         linkSourceDirectory))
      {
      this->AppendLinkedResource(fout, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
      }

    }

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeOutputDirectory);

    this->CreateLinksForTargets(fout);
    }

  fout << "\t</linkedResources>\n";

  fout << "</projectDescription>\n";
}